

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O0

void Wlc_NtkPrintInvStats(Wlc_Ntk_t *pNtk,Vec_Int_t *vCounts,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Wlc_Obj_t *p;
  char *pcVar4;
  int local_3c;
  int nBits;
  int nRange;
  int nNum;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  int fVerbose_local;
  Vec_Int_t *vCounts_local;
  Wlc_Ntk_t *pNtk_local;
  
  local_3c = 0;
  for (nNum = 0; iVar1 = Wlc_NtkCiNum(pNtk), nNum < iVar1; nNum = nNum + 1) {
    p = Wlc_NtkCi(pNtk,nNum);
    if ((undefined1  [24])((undefined1  [24])*p & (undefined1  [24])0x3f) == (undefined1  [24])0x3)
    {
      iVar1 = Wlc_ObjRange(p);
      nRange = 0;
      while ((nRange < iVar1 && (iVar2 = Vec_IntEntry(vCounts,local_3c + nRange), iVar2 == 0))) {
        nRange = nRange + 1;
      }
      if (nRange == iVar1) {
        local_3c = iVar1 + local_3c;
      }
      else {
        iVar2 = Wlc_ObjId(pNtk,p);
        pcVar4 = Wlc_ObjName(pNtk,iVar2);
        printf("%s[%d:%d] : ",pcVar4,(ulong)(uint)p->End,(ulong)(uint)p->Beg);
        for (nRange = 0; nRange < iVar1; nRange = nRange + 1) {
          uVar3 = Vec_IntEntry(vCounts,local_3c + nRange);
          if (uVar3 != 0) {
            printf("  [%d] -> %d",(ulong)(uint)nRange,(ulong)uVar3);
          }
        }
        printf("\n");
        local_3c = iVar1 + local_3c;
      }
    }
  }
  iVar1 = Vec_IntSize(vCounts);
  if (iVar1 == local_3c) {
    return;
  }
  __assert_fail("Vec_IntSize(vCounts) == nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcAbc.c"
                ,0x81,"void Wlc_NtkPrintInvStats(Wlc_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vCounts, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vCounts, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vCounts, nBits + k );
            if ( nNum == 0 )
                continue;
            printf( "  [%d] -> %d", k, nNum );
        }
        printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vCounts), nBits );
    assert( Vec_IntSize(vCounts) == nBits );
}